

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

_Bool tlb_force_broadcast(CPUARMState_conflict *env)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  
  if (((env->cp15).hcr_el2 & 0x200) == 0) {
    return false;
  }
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if (uVar2 == 0x10) {
        uVar2 = 0;
      }
      else if (uVar2 == 0x16) {
        uVar2 = 3;
      }
      else if (uVar2 == 0x1a) {
        uVar2 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          bVar3 = uVar2 == 0x16;
          if (!bVar3) {
            bVar3 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if ((((uint)uVar1 >> 0x1c & 1) == 0) && (uVar2 = 3, bVar3)) goto LAB_0061f581;
        }
        uVar2 = 1;
      }
    }
    else {
      uVar2 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar2 = 1;
    if ((env->v7m).exception == 0) {
      uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061f581:
  if (((uVar1 & 0x200000000) != 0) && (uVar2 == 1)) {
    return ((env->cp15).scr_el3 & 1) == 0;
  }
  return false;
}

Assistant:

static bool tlb_force_broadcast(CPUARMState *env)
{
    return (env->cp15.hcr_el2 & HCR_FB) &&
        arm_current_el(env) == 1 && arm_is_secure_below_el3(env);
}